

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::init(SRGBTestCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  deUint32 dVar2;
  int extraout_EAX;
  TypedObjectWrapper<(glu::ObjectType)3> *this_00;
  NotSupportedError *pNVar3;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  in_stack_ffffffffffffffb8;
  string local_38;
  
  dVar2 = glu::getInternalFormat(this->m_internalFormat);
  if (dVar2 == 0x8c43) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_texture_sRGB_decode");
    if (!bVar1) {
      pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Test requires GL_EXT_texture_sRGB_decode extension",
                 (allocator<char> *)&stack0xffffffffffffffc7);
      tcu::NotSupportedError::NotSupportedError(pNVar3,&local_38);
      __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  dVar2 = glu::getInternalFormat(this->m_internalFormat);
  if (dVar2 == 0x8fbd) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_sRGB_R8");
    if (!bVar1) {
      pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Test requires GL_EXT_texture_sRGB_R8 extension",
                 (allocator<char> *)&stack0xffffffffffffffc7);
      tcu::NotSupportedError::NotSupportedError(pNVar3,&local_38);
      __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_00 = (TypedObjectWrapper<(glu::ObjectType)3> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            (this_00,((this->super_TestCase).m_context)->m_renderCtx);
  local_38._M_dataplus._M_p = (pointer)0x0;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::assignData(&(this->m_framebuffer).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               ,in_stack_ffffffffffffffb8);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 *)&local_38);
  return extraout_EAX;
}

Assistant:

void SRGBTestCase::init (void)
{
	// extension requirements for test
	if ( (glu::getInternalFormat(m_internalFormat) == GL_SRGB8_ALPHA8) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_sRGB_decode") )
	{
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_sRGB_decode extension");
	}

	if ( (glu::getInternalFormat(m_internalFormat) == GL_SR8_EXT) && !(m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_sRGB_R8")) )
	{
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_sRGB_R8 extension");
	}

	m_framebuffer = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
}